

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::internal::BenchmarkImp::ThreadPerCpu(BenchmarkImp *this)

{
  int iVar1;
  value_type *in_stack_ffffffffffffffe8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffff0;
  
  if (ThreadPerCpu()::num_cpus == '\0') {
    iVar1 = __cxa_guard_acquire(&ThreadPerCpu()::num_cpus);
    if (iVar1 != 0) {
      ThreadPerCpu::num_cpus = NumCPUs();
      __cxa_guard_release(&ThreadPerCpu()::num_cpus);
    }
  }
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void BenchmarkImp::ThreadPerCpu() {
  static int num_cpus = NumCPUs();
  thread_counts_.push_back(num_cpus);
}